

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

double soplex::MPSgetRHS<double>(double left,double right)

{
  double dVar1;
  double *pdVar2;
  SPxInternalCodeException *this;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double rhsval;
  string *in_stack_ffffffffffffff88;
  allocator local_39;
  string local_38 [32];
  double local_18;
  double local_10;
  double local_8;
  
  local_10 = in_XMM1_Qa;
  local_8 = in_XMM0_Qa;
  pdVar2 = (double *)infinity();
  dVar1 = local_10;
  if (in_XMM0_Qa <= -*pdVar2) {
    pdVar2 = (double *)infinity();
    if (*pdVar2 <= dVar1) {
      this = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_38,"XMPSWR01 This should never happen.",&local_39);
      SPxInternalCodeException::SPxInternalCodeException(this,in_stack_ffffffffffffff88);
      __cxa_throw(this,&SPxInternalCodeException::typeinfo,
                  SPxInternalCodeException::~SPxInternalCodeException);
    }
    local_18 = local_10;
  }
  else {
    local_18 = local_8;
  }
  return local_18;
}

Assistant:

static R MPSgetRHS(R left, R right)
{
   R rhsval;

   if(left > R(-infinity))   /// This includes ranges
      rhsval = left;
   else if(right <  R(infinity))
      rhsval = right;
   else
      throw SPxInternalCodeException("XMPSWR01 This should never happen.");

   return rhsval;
}